

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_constraints.cpp
# Opt level: O1

void duckdb::DuckDBConstraintsFunction
               (ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  pointer pVVar1;
  GlobalTableFunctionState *pGVar2;
  TableCatalogEntry *this;
  pointer pcVar3;
  SchemaCatalogEntry *pSVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  pointer pbVar8;
  char cVar9;
  reference pvVar10;
  vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
  *pvVar11;
  const_reference this_00;
  pointer pCVar12;
  UniqueConstraint *this_01;
  ForeignKeyConstraint *pFVar13;
  string *psVar14;
  idx_t val;
  long lVar15;
  type constraint;
  TableCatalogEntry *table;
  iterator iVar16;
  undefined8 *puVar17;
  CheckConstraint *pCVar18;
  pointer pPVar19;
  NotImplementedException *this_02;
  char *pcVar20;
  ulong uVar21;
  size_type *psVar22;
  ulong __val;
  element_type *peVar23;
  char cVar24;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var25;
  pointer pVVar26;
  _func_int **pp_Var27;
  ExtraConstraintInfo *info_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar28;
  pointer pbVar29;
  bool bVar30;
  vector<duckdb::Value,_true> column_index_list;
  Value expression_text;
  string constraint_type;
  string constraint_name;
  vector<duckdb::Value,_true> referenced_column_name_list;
  vector<duckdb::Value,_true> column_name_list;
  ExtraConstraintInfo info;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  idx_t local_3d0;
  pointer local_3a8;
  pointer pVStack_3a0;
  pointer local_398 [2];
  Value local_388;
  undefined1 *local_348;
  char *local_340;
  undefined1 local_338 [16];
  string local_328;
  pointer local_308;
  pointer pVStack_300;
  pointer local_2f8;
  pointer local_2e8;
  pointer pVStack_2e0;
  pointer local_2d8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_2d0;
  undefined1 local_2c8 [32];
  Val local_2a8;
  _Alloc_hider local_298;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  pointer local_278;
  pointer local_270;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_260;
  uint local_258;
  undefined4 uStack_254;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_250 [6];
  LogicalType local_220;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  vector<duckdb::ConstraintEntry,_true> *local_188;
  vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
  *local_180;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  vector<duckdb::Value,_true> local_f8;
  vector<duckdb::Value,_true> local_d8;
  vector<duckdb::Value,_true> local_b8;
  string local_a0;
  string local_80;
  LogicalType local_60;
  LogicalType local_48;
  
  optional_ptr<duckdb::GlobalTableFunctionState,_true>::CheckValid(&data_p->global_state);
  pGVar2 = (data_p->global_state).ptr;
  if (pGVar2[4]._vptr_GlobalTableFunctionState <
      (_func_int **)
      ((long)pGVar2[2]._vptr_GlobalTableFunctionState -
       (long)pGVar2[1]._vptr_GlobalTableFunctionState >> 5)) {
    pp_Var27 = pGVar2[4]._vptr_GlobalTableFunctionState;
    if (pp_Var27 <
        (_func_int **)
        ((long)pGVar2[2]._vptr_GlobalTableFunctionState -
         (long)pGVar2[1]._vptr_GlobalTableFunctionState >> 5)) {
      local_188 = (vector<duckdb::ConstraintEntry,_true> *)(pGVar2 + 1);
      local_2d0 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)(pGVar2 + 7);
      local_3d0 = 0;
      do {
        pvVar10 = vector<duckdb::ConstraintEntry,_true>::operator[](local_188,(size_type)pp_Var27);
        this = pvVar10->table;
        pvVar11 = TableCatalogEntry::GetConstraints(this);
        pp_Var27 = pGVar2[5]._vptr_GlobalTableFunctionState;
        bVar30 = pp_Var27 <
                 (_func_int **)
                 ((long)(pvVar11->
                        super_vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
                        ).
                        super__Vector_base<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pvVar11->
                        super_vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
                        ).
                        super__Vector_base<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3);
        if (bVar30) {
LAB_0151f08a:
          local_180 = pvVar11;
          this_00 = vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
                    ::operator[](local_180,(size_type)pp_Var27);
          local_348 = local_338;
          local_340 = (char *)0x0;
          local_338[0] = 0;
          pCVar12 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                    operator->(this_00);
          switch(pCVar12->type) {
          case NOT_NULL:
            info_00 = (ExtraConstraintInfo *)0x8;
            pcVar20 = "NOT NULL";
            break;
          case CHECK:
            info_00 = (ExtraConstraintInfo *)0x5;
            pcVar20 = "CHECK";
            break;
          case UNIQUE:
            pCVar12 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>
                      ::operator->(this_00);
            this_01 = Constraint::Cast<duckdb::UniqueConstraint>(pCVar12);
            bVar30 = UniqueConstraint::IsPrimaryKey(this_01);
            pcVar20 = " UNIQUE";
            if (bVar30) {
              pcVar20 = " PRIMARY KEY";
            }
            info_00 = (ExtraConstraintInfo *)((ulong)bVar30 * 5 + 6);
            ::std::__cxx11::string::_M_replace((ulong)&local_348,0,local_340,(ulong)(pcVar20 + 1));
            goto LAB_0151f1ac;
          case FOREIGN_KEY:
            pCVar12 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>
                      ::operator->(this_00);
            pFVar13 = Constraint::Cast<duckdb::ForeignKeyConstraint>(pCVar12);
            if ((pFVar13->info).type != FK_TYPE_PRIMARY_KEY_TABLE) {
              info_00 = (ExtraConstraintInfo *)0xb;
              ::std::__cxx11::string::_M_replace((ulong)&local_348,0,local_340,0x1e233f5);
              goto LAB_0151f1ac;
            }
            goto LAB_0151fefe;
          default:
            this_02 = (NotImplementedException *)__cxa_allocate_exception(0x10);
            local_2c8._0_8_ = local_2c8 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_2c8,"Unimplemented constraint for duckdb_constraints","");
            NotImplementedException::NotImplementedException(this_02,(string *)local_2c8);
            __cxa_throw(this_02,&NotImplementedException::typeinfo,
                        ::std::runtime_error::~runtime_error);
          }
          ::std::__cxx11::string::_M_replace((ulong)&local_348,0,local_340,(ulong)pcVar20);
LAB_0151f1ac:
          psVar14 = Catalog::GetName_abi_cxx11_
                              ((((this->super_StandardEntry).schema)->super_InCatalogEntry).catalog)
          ;
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          pcVar3 = (psVar14->_M_dataplus)._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_118,pcVar3,pcVar3 + psVar14->_M_string_length);
          Value::Value((Value *)local_2c8,&local_118);
          DataChunk::SetValue(output,0,local_3d0,(Value *)local_2c8);
          Value::~Value((Value *)local_2c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p);
          }
          val = Catalog::GetOid((((this->super_StandardEntry).schema)->super_InCatalogEntry).catalog
                               );
          lVar15 = NumericCastImpl<long,_unsigned_long,_false>::Convert(val);
          Value::BIGINT((Value *)local_2c8,lVar15);
          DataChunk::SetValue(output,1,local_3d0,(Value *)local_2c8);
          Value::~Value((Value *)local_2c8);
          pSVar4 = (this->super_StandardEntry).schema;
          local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
          pcVar3 = (pSVar4->super_InCatalogEntry).super_CatalogEntry.name._M_dataplus._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_138,pcVar3,
                     pcVar3 + (pSVar4->super_InCatalogEntry).super_CatalogEntry.name.
                              _M_string_length);
          Value::Value((Value *)local_2c8,&local_138);
          DataChunk::SetValue(output,2,local_3d0,(Value *)local_2c8);
          Value::~Value((Value *)local_2c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p);
          }
          lVar15 = NumericCastImpl<long,_unsigned_long,_false>::Convert
                             ((((this->super_StandardEntry).schema)->super_InCatalogEntry).
                              super_CatalogEntry.oid);
          Value::BIGINT((Value *)local_2c8,lVar15);
          DataChunk::SetValue(output,3,local_3d0,(Value *)local_2c8);
          Value::~Value((Value *)local_2c8);
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
          pcVar3 = (this->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.name.
                   _M_dataplus._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_158,pcVar3,
                     pcVar3 + (this->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
                              name._M_string_length);
          Value::Value((Value *)local_2c8,&local_158);
          DataChunk::SetValue(output,4,local_3d0,(Value *)local_2c8);
          Value::~Value((Value *)local_2c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p);
          }
          lVar15 = NumericCastImpl<long,_unsigned_long,_false>::Convert
                             ((this->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
                              oid);
          Value::BIGINT((Value *)local_2c8,lVar15);
          DataChunk::SetValue(output,5,local_3d0,(Value *)local_2c8);
          Value::~Value((Value *)local_2c8);
          constraint = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>
                       ::operator*(this_00);
          GetExtraConstraintInfo((ExtraConstraintInfo *)local_2c8,this,constraint);
          table = (TableCatalogEntry *)
                  unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                  operator*(this_00);
          GetConstraintName_abi_cxx11_
                    (&local_328,(duckdb *)this,table,(Constraint *)local_2c8,info_00);
          iVar16 = ::std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   ::find(local_2d0,&local_328);
          if (iVar16.
              super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ._M_cur != (__node_type *)0x0) {
            __val = 2;
            do {
              local_260 = local_250;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_260,local_328._M_dataplus._M_p,
                         local_328._M_dataplus._M_p + local_328._M_string_length);
              ::std::__cxx11::string::append((char *)&local_260);
              cVar24 = '\x01';
              if (9 < __val) {
                uVar21 = __val;
                cVar9 = '\x04';
                do {
                  cVar24 = cVar9;
                  if (uVar21 < 100) {
                    cVar24 = cVar24 + -2;
                    goto LAB_0151f4e8;
                  }
                  if (uVar21 < 1000) {
                    cVar24 = cVar24 + -1;
                    goto LAB_0151f4e8;
                  }
                  if (uVar21 < 10000) goto LAB_0151f4e8;
                  bVar30 = 99999 < uVar21;
                  uVar21 = uVar21 / 10000;
                  cVar9 = cVar24 + '\x04';
                } while (bVar30);
                cVar24 = cVar24 + '\x01';
              }
LAB_0151f4e8:
              local_3a8 = (pointer)local_398;
              ::std::__cxx11::string::_M_construct((ulong)&local_3a8,cVar24);
              ::std::__detail::__to_chars_10_impl<unsigned_long>
                        ((char *)local_3a8,(uint)pVStack_3a0,__val);
              _Var25._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(pointer)0xf;
              if (local_260 != local_250) {
                _Var25._M_pi = local_250[0]._M_pi;
              }
              pVVar1 = (pointer)((long)pVStack_3a0 + CONCAT44(uStack_254,local_258));
              if (_Var25._M_pi < pVVar1) {
                pVVar26 = (pointer)0xf;
                if (local_3a8 != (pointer)local_398) {
                  pVVar26 = local_398[0];
                }
                if (pVVar26 < pVVar1) goto LAB_0151f552;
                puVar17 = (undefined8 *)
                          ::std::__cxx11::string::replace
                                    ((ulong)&local_3a8,0,(char *)0x0,(ulong)local_260);
              }
              else {
LAB_0151f552:
                puVar17 = (undefined8 *)
                          ::std::__cxx11::string::_M_append((char *)&local_260,(ulong)local_3a8);
              }
              local_388.type_._0_8_ =
                   &local_388.type_.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount;
              psVar22 = puVar17 + 2;
              if ((size_type *)*puVar17 == psVar22) {
                local_388.type_.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*psVar22;
                local_388._24_8_ = puVar17[3];
              }
              else {
                local_388.type_.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*psVar22;
                local_388.type_._0_8_ = (size_type *)*puVar17;
              }
              local_388.type_.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)puVar17[1];
              *puVar17 = psVar22;
              puVar17[1] = 0;
              *(char *)psVar22 = '\0';
              iVar16 = ::std::
                       _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       ::find(local_2d0,(key_type *)&local_388);
              if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_388.type_._0_8_ !=
                  &local_388.type_.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ) {
                operator_delete((void *)local_388.type_._0_8_);
              }
              if (local_3a8 != (pointer)local_398) {
                operator_delete(local_3a8);
              }
              if (local_260 != local_250) {
                operator_delete(local_260);
              }
              if (iVar16.
                  super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ._M_cur == (__node_type *)0x0) goto LAB_0151f60e;
              __val = __val + 1;
            } while( true );
          }
          goto LAB_0151f725;
        }
LAB_0151ff52:
        if (!bVar30) {
          pGVar2[5]._vptr_GlobalTableFunctionState = (_func_int **)0x0;
          pGVar2[4]._vptr_GlobalTableFunctionState =
               (_func_int **)((long)pGVar2[4]._vptr_GlobalTableFunctionState + 1);
        }
        pp_Var27 = pGVar2[4]._vptr_GlobalTableFunctionState;
      } while ((pp_Var27 <
                (_func_int **)
                ((long)pGVar2[2]._vptr_GlobalTableFunctionState -
                 (long)pGVar2[1]._vptr_GlobalTableFunctionState >> 5)) && (local_3d0 < 0x800));
    }
    else {
      local_3d0 = 0;
    }
    output->count = local_3d0;
  }
  return;
LAB_0151f60e:
  cVar24 = '\x01';
  if (9 < __val) {
    uVar21 = __val;
    cVar9 = '\x04';
    do {
      cVar24 = cVar9;
      if (uVar21 < 100) {
        cVar24 = cVar24 + -2;
        goto LAB_0151f65e;
      }
      if (uVar21 < 1000) {
        cVar24 = cVar24 + -1;
        goto LAB_0151f65e;
      }
      if (uVar21 < 10000) goto LAB_0151f65e;
      bVar30 = 99999 < uVar21;
      uVar21 = uVar21 / 10000;
      cVar9 = cVar24 + '\x04';
    } while (bVar30);
    cVar24 = cVar24 + '\x01';
  }
LAB_0151f65e:
  local_260 = local_250;
  ::std::__cxx11::string::_M_construct((ulong)&local_260,cVar24);
  ::std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_260,local_258,__val);
  puVar17 = (undefined8 *)::std::__cxx11::string::replace((ulong)&local_260,0,(char *)0x0,0x1e47880)
  ;
  local_388.type_._0_8_ =
       &local_388.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  psVar22 = puVar17 + 2;
  if ((size_type *)*puVar17 == psVar22) {
    local_388.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*psVar22;
    local_388._24_8_ = puVar17[3];
  }
  else {
    local_388.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*psVar22;
    local_388.type_._0_8_ = (size_type *)*puVar17;
  }
  local_388.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)puVar17[1];
  *puVar17 = psVar22;
  puVar17[1] = 0;
  *(undefined1 *)(puVar17 + 2) = 0;
  ::std::__cxx11::string::_M_append((char *)&local_328,local_388.type_._0_8_);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_388.type_._0_8_ !=
      &local_388.type_.type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
    operator_delete((void *)local_388.type_._0_8_);
  }
  if (local_260 != local_250) {
    operator_delete(local_260);
  }
LAB_0151f725:
  pp_Var27 = pGVar2[6]._vptr_GlobalTableFunctionState;
  pGVar2[6]._vptr_GlobalTableFunctionState = (_func_int **)((long)pp_Var27 + 1);
  lVar15 = NumericCastImpl<long,_unsigned_long,_false>::Convert((unsigned_long)pp_Var27);
  Value::BIGINT(&local_388,lVar15);
  DataChunk::SetValue(output,6,local_3d0,&local_388);
  Value::~Value(&local_388);
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_178,local_348,local_340 + (long)local_348);
  Value::Value(&local_388,&local_178);
  DataChunk::SetValue(output,7,local_3d0,&local_388);
  Value::~Value(&local_388);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p);
  }
  pCVar12 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
            operator->(this_00);
  (*pCVar12->_vptr_Constraint[2])(&local_80,pCVar12);
  Value::Value(&local_388,&local_80);
  DataChunk::SetValue(output,8,local_3d0,&local_388);
  Value::~Value(&local_388);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  LogicalType::LogicalType(&local_48,SQLNULL);
  Value::Value(&local_388,&local_48);
  LogicalType::~LogicalType(&local_48);
  pCVar12 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
            operator->(this_00);
  if (pCVar12->type == CHECK) {
    pCVar12 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
              operator->(this_00);
    pCVar18 = Constraint::Cast<duckdb::CheckConstraint>(pCVar12);
    pPVar19 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator->(&pCVar18->expression);
    (*(pPVar19->super_BaseExpression)._vptr_BaseExpression[8])(&local_a0,pPVar19);
    Value::Value((Value *)&local_260,&local_a0);
    Value::operator=(&local_388,(Value *)&local_260);
    Value::~Value((Value *)&local_260);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
  }
  DataChunk::SetValue(output,9,local_3d0,&local_388);
  uVar6 = local_2c8._8_8_;
  local_3a8 = (pointer)0x0;
  pVStack_3a0 = (pointer)0x0;
  local_398[0] = (pointer)0x0;
  local_2d8 = (pointer)0x0;
  local_2e8 = (pointer)0x0;
  pVStack_2e0 = (pointer)0x0;
  local_2f8 = (pointer)0x0;
  local_308 = (pointer)0x0;
  pVStack_300 = (pointer)0x0;
  for (peVar23 = (element_type *)local_2c8._0_8_; uVar7 = local_2a8.bigint,
      peVar23 != (element_type *)uVar6; peVar23 = (element_type *)&peVar23->type) {
    Value::UBIGINT((Value *)&local_260,(uint64_t)peVar23->_vptr_ExtraTypeInfo);
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_3a8,
               (Value *)&local_260);
    Value::~Value((Value *)&local_260);
  }
  if (local_2c8._24_8_ != local_2a8.bigint) {
    paVar28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_2c8._24_8_ + 0x10);
    do {
      local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
      if (paVar28 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(&paVar28->_M_allocated_capacity)[-2]) {
        local_1a8.field_2._M_allocated_capacity = paVar28->_M_allocated_capacity;
        local_1a8.field_2._8_8_ = (&paVar28->_M_allocated_capacity)[1];
      }
      else {
        local_1a8.field_2._M_allocated_capacity = paVar28->_M_allocated_capacity;
        local_1a8._M_dataplus._M_p = (pointer)(&paVar28->_M_allocated_capacity)[-2];
      }
      local_1a8._M_string_length = (&paVar28->_M_allocated_capacity)[-1];
      (&paVar28->_M_allocated_capacity)[-2] = (size_type)paVar28;
      (&paVar28->_M_allocated_capacity)[-1] = 0;
      paVar28->_M_local_buf[0] = '\0';
      Value::Value((Value *)&local_260,&local_1a8);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_2e8,
                 (Value *)&local_260);
      Value::~Value((Value *)&local_260);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p);
      }
      psVar22 = &paVar28->_M_allocated_capacity + 2;
      paVar28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(&paVar28->_M_allocated_capacity + 4);
    } while (psVar22 != (size_type *)uVar7);
  }
  pbVar8 = local_270;
  if (local_278 != local_270) {
    paVar28 = &local_278->field_2;
    do {
      local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
      paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (paVar28 + -1))->_M_dataplus)._M_p;
      if (paVar28 == paVar5) {
        local_1c8.field_2._M_allocated_capacity = paVar28->_M_allocated_capacity;
        local_1c8.field_2._8_8_ = *(undefined8 *)((long)paVar28 + 8);
      }
      else {
        local_1c8.field_2._M_allocated_capacity = paVar28->_M_allocated_capacity;
        local_1c8._M_dataplus._M_p = (pointer)paVar5;
      }
      local_1c8._M_string_length = *(size_type *)((long)paVar28 + -8);
      (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(paVar28 + -1))->
      _M_dataplus)._M_p = (pointer)paVar28;
      *(size_type *)((long)paVar28 + -8) = 0;
      paVar28->_M_local_buf[0] = '\0';
      Value::Value((Value *)&local_260,&local_1c8);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_308,
                 (Value *)&local_260);
      Value::~Value((Value *)&local_260);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p);
      }
      pbVar29 = (pointer)(paVar28 + 1);
      paVar28 = paVar28 + 2;
    } while (pbVar29 != pbVar8);
  }
  LogicalType::LogicalType(&local_220,BIGINT);
  local_b8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = local_3a8;
  local_b8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = pVStack_3a0;
  local_b8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_398[0];
  local_3a8 = (pointer)0x0;
  pVStack_3a0 = (pointer)0x0;
  local_398[0] = (pointer)0x0;
  Value::LIST((Value *)&local_260,&local_220,&local_b8);
  DataChunk::SetValue(output,10,local_3d0,(Value *)&local_260);
  Value::~Value((Value *)&local_260);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_b8);
  LogicalType::~LogicalType(&local_220);
  LogicalType::LogicalType(&local_220,VARCHAR);
  local_d8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = local_2e8;
  local_d8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = pVStack_2e0;
  local_d8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_2d8;
  local_2e8 = (pointer)0x0;
  pVStack_2e0 = (pointer)0x0;
  local_2d8 = (pointer)0x0;
  Value::LIST((Value *)&local_260,&local_220,&local_d8);
  DataChunk::SetValue(output,0xb,local_3d0,(Value *)&local_260);
  Value::~Value((Value *)&local_260);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_d8);
  LogicalType::~LogicalType(&local_220);
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p == &local_328.field_2) {
    local_1e8.field_2._8_8_ = local_328.field_2._8_8_;
  }
  else {
    local_1e8._M_dataplus._M_p = local_328._M_dataplus._M_p;
  }
  local_1e8.field_2._M_allocated_capacity._1_7_ = local_328.field_2._M_allocated_capacity._1_7_;
  local_1e8.field_2._M_local_buf[0] = local_328.field_2._M_local_buf[0];
  local_1e8._M_string_length = local_328._M_string_length;
  local_328._M_string_length = 0;
  local_328.field_2._M_local_buf[0] = '\0';
  local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
  Value::Value((Value *)&local_260,&local_1e8);
  DataChunk::SetValue(output,0xc,local_3d0,(Value *)&local_260);
  Value::~Value((Value *)&local_260);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p);
  }
  _Var25._M_pi = local_290._M_pi;
  if (local_290._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    LogicalType::LogicalType(&local_60,SQLNULL);
    Value::Value((Value *)&local_260,&local_60);
  }
  else {
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_p == &local_288) {
      local_208.field_2._8_8_ = local_288._8_8_;
    }
    else {
      local_208._M_dataplus._M_p = local_298._M_p;
    }
    local_208.field_2._M_allocated_capacity._1_7_ = local_288._M_allocated_capacity._1_7_;
    local_208.field_2._M_local_buf[0] = local_288._M_local_buf[0];
    local_208._M_string_length = (size_type)local_290._M_pi;
    local_290._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_288._M_local_buf[0] = '\0';
    local_298._M_p = (pointer)&local_288;
    Value::Value((Value *)&local_260,&local_208);
  }
  DataChunk::SetValue(output,0xd,local_3d0,(Value *)&local_260);
  Value::~Value((Value *)&local_260);
  if (_Var25._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    LogicalType::~LogicalType(&local_60);
  }
  else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  LogicalType::LogicalType(&local_220,VARCHAR);
  local_f8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = local_308;
  local_f8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = pVStack_300;
  local_f8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_2f8;
  local_308 = (pointer)0x0;
  pVStack_300 = (pointer)0x0;
  local_2f8 = (pointer)0x0;
  Value::LIST((Value *)&local_260,&local_220,&local_f8);
  DataChunk::SetValue(output,0xe,local_3d0,(Value *)&local_260);
  Value::~Value((Value *)&local_260);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_f8);
  LogicalType::~LogicalType(&local_220);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_308);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_2e8);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_3a8);
  Value::~Value(&local_388);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p);
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_278);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_p != &local_288) {
    operator_delete(local_298._M_p);
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_2c8 + 0x18));
  if ((element_type *)local_2c8._0_8_ != (element_type *)0x0) {
    operator_delete((void *)local_2c8._0_8_);
  }
  local_3d0 = local_3d0 + 1;
LAB_0151fefe:
  if (local_348 != local_338) {
    operator_delete(local_348);
  }
  pp_Var27 = (_func_int **)((long)pGVar2[5]._vptr_GlobalTableFunctionState + 1);
  pGVar2[5]._vptr_GlobalTableFunctionState = pp_Var27;
  bVar30 = pp_Var27 <
           (_func_int **)
           ((long)(local_180->
                  super_vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
                  ).
                  super__Vector_base<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(local_180->
                  super_vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
                  ).
                  super__Vector_base<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3);
  if ((!bVar30) || (pvVar11 = local_180, 0x7ff < local_3d0)) goto LAB_0151ff52;
  goto LAB_0151f08a;
}

Assistant:

void DuckDBConstraintsFunction(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &data = data_p.global_state->Cast<DuckDBConstraintsData>();
	if (data.offset >= data.entries.size()) {
		// finished returning values
		return;
	}
	// start returning values
	// either fill up the chunk or return all the remaining columns
	idx_t count = 0;
	while (data.offset < data.entries.size() && count < STANDARD_VECTOR_SIZE) {
		auto &entry = data.entries[data.offset];

		auto &table = entry.table;
		auto &constraints = table.GetConstraints();
		for (; data.constraint_offset < constraints.size() && count < STANDARD_VECTOR_SIZE; data.constraint_offset++) {
			auto &constraint = constraints[data.constraint_offset];
			// return values:
			// constraint_type, VARCHAR
			// Processing this first due to shortcut (early continue)
			string constraint_type;
			switch (constraint->type) {
			case ConstraintType::CHECK:
				constraint_type = "CHECK";
				break;
			case ConstraintType::UNIQUE: {
				auto &unique = constraint->Cast<UniqueConstraint>();
				constraint_type = unique.IsPrimaryKey() ? "PRIMARY KEY" : "UNIQUE";
				break;
			}
			case ConstraintType::NOT_NULL:
				constraint_type = "NOT NULL";
				break;
			case ConstraintType::FOREIGN_KEY: {
				auto &fk = constraint->Cast<ForeignKeyConstraint>();
				if (fk.info.type == ForeignKeyType::FK_TYPE_PRIMARY_KEY_TABLE) {
					// Those are already covered by PRIMARY KEY and UNIQUE entries
					continue;
				}
				constraint_type = "FOREIGN KEY";
				break;
			}
			default:
				throw NotImplementedException("Unimplemented constraint for duckdb_constraints");
			}

			idx_t col = 0;
			// database_name, LogicalType::VARCHAR
			output.SetValue(col++, count, Value(table.schema.catalog.GetName()));
			// database_oid, LogicalType::BIGINT
			output.SetValue(col++, count, Value::BIGINT(NumericCast<int64_t>(table.schema.catalog.GetOid())));
			// schema_name, LogicalType::VARCHAR
			output.SetValue(col++, count, Value(table.schema.name));
			// schema_oid, LogicalType::BIGINT
			output.SetValue(col++, count, Value::BIGINT(NumericCast<int64_t>(table.schema.oid)));
			// table_name, LogicalType::VARCHAR
			output.SetValue(col++, count, Value(table.name));
			// table_oid, LogicalType::BIGINT
			output.SetValue(col++, count, Value::BIGINT(NumericCast<int64_t>(table.oid)));

			auto info = GetExtraConstraintInfo(table, *constraint);
			auto constraint_name = GetConstraintName(table, *constraint, info);
			if (data.constraint_names.find(constraint_name) != data.constraint_names.end()) {
				// duplicate constraint name
				idx_t index = 2;
				while (data.constraint_names.find(constraint_name + "_" + to_string(index)) !=
				       data.constraint_names.end()) {
					index++;
				}
				constraint_name += "_" + to_string(index);
			}
			// constraint_index, BIGINT
			output.SetValue(col++, count, Value::BIGINT(NumericCast<int64_t>(data.unique_constraint_offset++)));

			// constraint_type, VARCHAR
			output.SetValue(col++, count, Value(constraint_type));

			// constraint_text, VARCHAR
			output.SetValue(col++, count, Value(constraint->ToString()));

			// expression, VARCHAR
			Value expression_text;
			if (constraint->type == ConstraintType::CHECK) {
				auto &check = constraint->Cast<CheckConstraint>();
				expression_text = Value(check.expression->ToString());
			}
			output.SetValue(col++, count, expression_text);

			vector<Value> column_index_list;
			vector<Value> column_name_list;
			vector<Value> referenced_column_name_list;
			for (auto &col_index : info.column_indexes) {
				column_index_list.push_back(Value::UBIGINT(col_index.index));
			}
			for (auto &name : info.column_names) {
				column_name_list.push_back(Value(std::move(name)));
			}
			for (auto &name : info.referenced_columns) {
				referenced_column_name_list.push_back(Value(std::move(name)));
			}
			// constraint_column_indexes, LIST
			output.SetValue(col++, count, Value::LIST(LogicalType::BIGINT, std::move(column_index_list)));

			// constraint_column_names, LIST
			output.SetValue(col++, count, Value::LIST(LogicalType::VARCHAR, std::move(column_name_list)));

			// constraint_name, VARCHAR
			output.SetValue(col++, count, Value(std::move(constraint_name)));

			// referenced_table, VARCHAR
			output.SetValue(col++, count,
			                info.referenced_table.empty() ? Value() : Value(std::move(info.referenced_table)));

			// referenced_column_names, LIST
			output.SetValue(col++, count, Value::LIST(LogicalType::VARCHAR, std::move(referenced_column_name_list)));
			count++;
		}

		if (data.constraint_offset >= constraints.size()) {
			data.constraint_offset = 0;
			data.offset++;
		}
	}
	output.SetCardinality(count);
}